

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tag.hpp
# Opt level: O0

cx_string<1UL> mserialize::detail::BuiltinTag<int,_void>::tag_string(void)

{
  size_t size;
  bool integral;
  bool sign;
  cx_string<1UL> local_2;
  
  cx_string<1UL>::cx_string(&local_2,"i");
  return (cx_string<1UL>)local_2._data;
}

Assistant:

static constexpr cx_string<1> tag_string()
  {
    using S = cx_string<1>;

    constexpr bool sign = std::is_signed<Arithmetic>::value;
    constexpr bool integral = std::is_integral<Arithmetic>::value;
    constexpr std::size_t size = sizeof(Arithmetic);

    return
      (std::is_same<Arithmetic, bool>::value) ? S("y")
    : (std::is_same<Arithmetic, char>::value) ? S("c")
    : (integral &&  sign && size == sizeof(std::int8_t))  ? S("b")
    : (integral &&  sign && size == sizeof(std::int16_t)) ? S("s")
    : (integral &&  sign && size == sizeof(std::int32_t)) ? S("i")
    : (integral &&  sign && size == sizeof(std::int64_t)) ? S("l")
    : (integral && !sign && size == sizeof(std::uint8_t))  ? S("B")
    : (integral && !sign && size == sizeof(std::uint16_t)) ? S("S")
    : (integral && !sign && size == sizeof(std::uint32_t)) ? S("I")
    : (integral && !sign && size == sizeof(std::uint64_t)) ? S("L")
    : (std::is_same<Arithmetic, float>::value) ? S("f")
    : (std::is_same<Arithmetic, double>::value) ? S("d")
    : (std::is_same<Arithmetic, long double>::value) ? S("D")
    : throw "This Arithmetic type is not taggable";
  }